

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O2

void __thiscall Assimp::FBX::LineGeometry::~LineGeometry(LineGeometry *this)

{
  (this->super_Geometry).super_Object._vptr_Object = (_func_int **)&PTR__LineGeometry_007f88d0;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_indices).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&(this->m_vertices).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
  Geometry::~Geometry(&this->super_Geometry);
  return;
}

Assistant:

LineGeometry::~LineGeometry() {
    // empty
}